

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue JS_ArraySpeciesCreate(JSContext *ctx,JSValue obj,JSValue len_val)

{
  int iVar1;
  BOOL BVar2;
  JSContext *pJVar3;
  ulong uVar4;
  ulong uVar5;
  JSValueUnion JVar6;
  JSRefCountHeader *p_2;
  JSValueUnion JVar7;
  ulong uVar8;
  ulong uVar9;
  JSRefCountHeader *p;
  JSValue v;
  JSValue func_obj;
  JSValue v_00;
  JSValue JVar10;
  JSValue JVar11;
  JSValue new_target;
  JSValue this_obj;
  JSValueUnion local_40;
  int64_t local_38;
  
  local_38 = len_val.tag;
  local_40 = len_val.u;
  iVar1 = JS_IsArray(ctx,obj);
  if (iVar1 < 0) {
LAB_00167bf3:
    JVar10 = (JSValue)(ZEXT816(6) << 0x40);
    uVar5 = 0;
    goto LAB_00167bf9;
  }
  if (iVar1 != 0) {
    JVar10 = JS_GetPropertyInternal(ctx,obj,0x3c,obj,0);
    uVar8 = JVar10.tag;
    JVar6 = JVar10.u;
    uVar5 = (ulong)JVar6.ptr & 0xffffffff00000000;
    if ((uVar8 & 0xffffffff) == 6) goto LAB_00167bf9;
    if (((int)JVar10.tag == -1) && ((*(byte *)((long)JVar6.ptr + 5) & 0x10) != 0)) {
      pJVar3 = JS_GetFunctionRealm(ctx,JVar10);
      if (pJVar3 == (JSContext *)0x0) {
        iVar1 = *JVar6.ptr;
        *(int *)JVar6.ptr = iVar1 + -1;
        if (iVar1 < 2) {
          __JS_FreeValueRT(ctx->rt,JVar10);
        }
        goto LAB_00167bf3;
      }
      if ((pJVar3 == ctx) || (BVar2 = js_same_value(ctx,JVar10,pJVar3->array_ctor), BVar2 == 0))
      goto LAB_00167a31;
      iVar1 = *JVar6.ptr;
      *(int *)JVar6.ptr = iVar1 + -1;
      uVar4 = 0;
      uVar8 = 3;
      if (iVar1 < 2) {
        __JS_FreeValueRT(ctx->rt,JVar10);
        uVar4 = 0;
      }
    }
    else {
LAB_00167a31:
      uVar4 = (ulong)JVar6.ptr & 0xffffffff;
    }
    uVar9 = uVar8;
    if ((int)uVar8 == -1) {
      JVar7.ptr = (void *)(uVar5 | uVar4);
      JVar10.tag = uVar8;
      JVar10.u.ptr = JVar7.ptr;
      this_obj.tag = uVar8;
      this_obj.u.ptr = JVar7.ptr;
      JVar10 = JS_GetPropertyInternal(ctx,JVar10,0xcf,this_obj,0);
      uVar9 = JVar10.tag;
      JVar6 = JVar10.u;
      iVar1 = *(int *)(uVar5 + uVar4);
      *(int *)(uVar5 + uVar4) = iVar1 + -1;
      if (iVar1 < 2) {
        v.tag = uVar8;
        v.u.ptr = JVar7.ptr;
        __JS_FreeValueRT(ctx->rt,v);
      }
      if ((uVar9 & 0xffffffff) == 6) {
        uVar5 = (ulong)JVar6.ptr & 0xffffffff00000000;
        goto LAB_00167bf9;
      }
      if ((int)JVar10.tag == 2) {
        uVar4 = 0;
        uVar9 = 3;
        uVar5 = 0;
      }
      else {
        uVar5 = (ulong)JVar6.ptr & 0xffffffff00000000;
        uVar4 = (ulong)JVar6.ptr & 0xffffffff;
      }
    }
    if ((uint)uVar9 != 3) {
      JVar6.ptr = (void *)(uVar5 | uVar4);
      func_obj.tag = uVar9;
      func_obj.u.ptr = JVar6.ptr;
      new_target.tag = uVar9;
      new_target.u.ptr = JVar6.ptr;
      JVar10 = JS_CallConstructorInternal(ctx,func_obj,new_target,1,(JSValue *)&local_40,2);
      if ((0xfffffff4 < (uint)uVar9) &&
         (iVar1 = *JVar6.ptr, *(int *)JVar6.ptr = iVar1 + -1, iVar1 < 2)) {
        v_00.tag = uVar9;
        v_00.u.ptr = JVar6.ptr;
        __JS_FreeValueRT(ctx->rt,v_00);
      }
      uVar5 = (ulong)JVar10.u.ptr & 0xffffffff00000000;
      goto LAB_00167bf9;
    }
  }
  JVar10 = js_array_constructor(ctx,(JSValue)(ZEXT816(3) << 0x40),1,(JSValue *)&local_40);
  uVar5 = (ulong)JVar10.u.ptr & 0xffffffff00000000;
LAB_00167bf9:
  JVar11.u.ptr = (void *)((ulong)JVar10.u.ptr & 0xffffffff | uVar5);
  JVar11.tag = JVar10.tag;
  return JVar11;
}

Assistant:

static JSValue JS_ArraySpeciesCreate(JSContext *ctx, JSValueConst obj,
                                     JSValueConst len_val)
{
    JSValue ctor, ret, species;
    int res;
    JSContext *realm;
    
    res = JS_IsArray(ctx, obj);
    if (res < 0)
        return JS_EXCEPTION;
    if (!res)
        return js_array_constructor(ctx, JS_UNDEFINED, 1, &len_val);
    ctor = JS_GetProperty(ctx, obj, JS_ATOM_constructor);
    if (JS_IsException(ctor))
        return ctor;
    if (JS_IsConstructor(ctx, ctor)) {
        /* legacy web compatibility */
        realm = JS_GetFunctionRealm(ctx, ctor);
        if (!realm) {
            JS_FreeValue(ctx, ctor);
            return JS_EXCEPTION;
        }
        if (realm != ctx &&
            js_same_value(ctx, ctor, realm->array_ctor)) {
            JS_FreeValue(ctx, ctor);
            ctor = JS_UNDEFINED;
        }
    }
    if (JS_IsObject(ctor)) {
        species = JS_GetProperty(ctx, ctor, JS_ATOM_Symbol_species);
        JS_FreeValue(ctx, ctor);
        if (JS_IsException(species))
            return species;
        ctor = species;
        if (JS_IsNull(ctor))
            ctor = JS_UNDEFINED;
    }
    if (JS_IsUndefined(ctor)) {
        return js_array_constructor(ctx, JS_UNDEFINED, 1, &len_val);
    } else {
        ret = JS_CallConstructor(ctx, ctor, 1, &len_val);
        JS_FreeValue(ctx, ctor);
        return ret;
    }
}